

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialSurfaceSMC.cpp
# Opt level: O1

void __thiscall
chrono::ChMaterialSurfaceSMC::ChMaterialSurfaceSMC
          (ChMaterialSurfaceSMC *this,ChMaterialSurfaceSMC *other)

{
  ChMaterialSurface::ChMaterialSurface
            (&this->super_ChMaterialSurface,&other->super_ChMaterialSurface);
  (this->super_ChMaterialSurface)._vptr_ChMaterialSurface =
       (_func_int **)&PTR__ChMaterialSurface_00b3d618;
  *(undefined4 *)&(this->super_ChMaterialSurface).field_0x1c =
       *(undefined4 *)&(other->super_ChMaterialSurface).field_0x1c;
  this->poisson_ratio = other->poisson_ratio;
  this->constant_adhesion = other->constant_adhesion;
  this->adhesionMultDMT = other->adhesionMultDMT;
  this->adhesionSPerko = other->adhesionSPerko;
  this->kn = other->kn;
  this->kt = other->kt;
  this->gn = other->gn;
  this->gt = other->gt;
  return;
}

Assistant:

ChMaterialSurfaceSMC::ChMaterialSurfaceSMC(const ChMaterialSurfaceSMC& other) : ChMaterialSurface(other) {
    young_modulus = other.young_modulus;
    poisson_ratio = other.poisson_ratio;
    constant_adhesion = other.constant_adhesion;
    adhesionMultDMT = other.adhesionMultDMT;
    adhesionSPerko = other.adhesionSPerko;
    kn = other.kn;
    kt = other.kt;
    gn = other.gn;
    gt = other.gt;
}